

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__read_cue_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_chunk_header *pChunkHeader,
                    ma_dr_wav_metadata *pMetadata)

{
  ma_uint32 mVar1;
  void *pBufferOut;
  ma_uint8 *pmVar2;
  undefined4 *in_RDX;
  long in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  ma_uint8 cuePointData [24];
  ma_uint32 iCuePoint;
  size_t bytesJustRead;
  ma_uint64 totalBytesRead;
  ma_uint8 cueHeaderSectionData [4];
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  ma_dr_wav__metadata_parser *in_stack_ffffffffffffffa8;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  ma_uint8 amStack_4c [4];
  ma_uint8 amStack_48 [4];
  ma_uint8 amStack_44 [8];
  uint local_3c;
  size_t local_38;
  ma_uint64 local_30;
  ma_uint8 local_24 [4];
  undefined4 *local_20;
  long local_18;
  ma_dr_wav__metadata_parser *local_10;
  ma_uint64 local_8;
  
  local_30 = 0;
  if (in_RDX == (undefined4 *)0x0) {
    local_8 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_38 = ma_dr_wav__metadata_parser_read
                         (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98,(ma_uint64 *)0x21747b);
    if (local_38 == 4) {
      *local_20 = 8;
      mVar1 = ma_dr_wav_bytes_to_u32(local_24);
      local_20[2] = mVar1;
      pBufferOut = (void *)(ulong)(uint)local_20[2];
      if (pBufferOut == (void *)((*(long *)(local_18 + 0x10) - 4U) / 0x18)) {
        pmVar2 = ma_dr_wav__metadata_get_memory(local_10,(ulong)(uint)local_20[2] * 0x18,8);
        *(ma_uint8 **)(local_20 + 4) = pmVar2;
        if (local_20[2] != 0) {
          local_3c = 0;
          while ((local_3c < (uint)local_20[2] &&
                 (local_38 = ma_dr_wav__metadata_parser_read
                                       (in_stack_ffffffffffffffa8,pBufferOut,
                                        in_stack_ffffffffffffff98,(ma_uint64 *)0x217549),
                 local_38 == 0x18))) {
            mVar1 = ma_dr_wav_bytes_to_u32(&stack0xffffffffffffffa8);
            *(ma_uint32 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18) = mVar1;
            mVar1 = ma_dr_wav_bytes_to_u32(&stack0xffffffffffffffac);
            *(ma_uint32 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 4) = mVar1;
            *(undefined1 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 8) = local_50;
            *(undefined1 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 9) = local_4f;
            *(undefined1 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 10) = local_4e;
            *(undefined1 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 0xb) = local_4d;
            mVar1 = ma_dr_wav_bytes_to_u32(amStack_4c);
            *(ma_uint32 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 0xc) = mVar1;
            mVar1 = ma_dr_wav_bytes_to_u32(amStack_48);
            *(ma_uint32 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 0x10) = mVar1;
            mVar1 = ma_dr_wav_bytes_to_u32(amStack_44);
            *(ma_uint32 *)(*(long *)(local_20 + 4) + (ulong)local_3c * 0x18 + 0x14) = mVar1;
            local_3c = local_3c + 1;
          }
        }
      }
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_cue_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, const ma_dr_wav_chunk_header* pChunkHeader, ma_dr_wav_metadata* pMetadata)
{
    ma_uint8 cueHeaderSectionData[MA_DR_WAV_CUE_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead;
    if (pMetadata == NULL) {
        return 0;
    }
    bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cueHeaderSectionData, sizeof(cueHeaderSectionData), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(cueHeaderSectionData)) {
        pMetadata->type                   = ma_dr_wav_metadata_type_cue;
        pMetadata->data.cue.cuePointCount = ma_dr_wav_bytes_to_u32(cueHeaderSectionData);
        if (pMetadata->data.cue.cuePointCount == (pChunkHeader->sizeInBytes - MA_DR_WAV_CUE_BYTES) / MA_DR_WAV_CUE_POINT_BYTES) {
            pMetadata->data.cue.pCuePoints    = (ma_dr_wav_cue_point*)ma_dr_wav__metadata_get_memory(pParser, sizeof(ma_dr_wav_cue_point) * pMetadata->data.cue.cuePointCount, MA_DR_WAV_METADATA_ALIGNMENT);
            MA_DR_WAV_ASSERT(pMetadata->data.cue.pCuePoints != NULL);
            if (pMetadata->data.cue.cuePointCount > 0) {
                ma_uint32 iCuePoint;
                for (iCuePoint = 0; iCuePoint < pMetadata->data.cue.cuePointCount; ++iCuePoint) {
                    ma_uint8 cuePointData[MA_DR_WAV_CUE_POINT_BYTES];
                    bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, cuePointData, sizeof(cuePointData), &totalBytesRead);
                    if (bytesJustRead == sizeof(cuePointData)) {
                        pMetadata->data.cue.pCuePoints[iCuePoint].id                = ma_dr_wav_bytes_to_u32(cuePointData + 0);
                        pMetadata->data.cue.pCuePoints[iCuePoint].playOrderPosition = ma_dr_wav_bytes_to_u32(cuePointData + 4);
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[0]    = cuePointData[8];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[1]    = cuePointData[9];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[2]    = cuePointData[10];
                        pMetadata->data.cue.pCuePoints[iCuePoint].dataChunkId[3]    = cuePointData[11];
                        pMetadata->data.cue.pCuePoints[iCuePoint].chunkStart        = ma_dr_wav_bytes_to_u32(cuePointData + 12);
                        pMetadata->data.cue.pCuePoints[iCuePoint].blockStart        = ma_dr_wav_bytes_to_u32(cuePointData + 16);
                        pMetadata->data.cue.pCuePoints[iCuePoint].sampleByteOffset  = ma_dr_wav_bytes_to_u32(cuePointData + 20);
                    } else {
                        break;
                    }
                }
            }
        }
    }
    return totalBytesRead;
}